

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmMakefileTargetGenerator::WriteObjectRuleFiles
          (cmMakefileTargetGenerator *this,cmSourceFile *source)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  string *psVar3;
  iterator iVar4;
  ostream *poVar5;
  string objFullPath;
  string obj;
  string srcFullPath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string dir;
  string local_238;
  key_type local_218;
  string local_1f8;
  string local_1d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8;
  undefined1 local_198 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [6];
  ios_base local_128 [264];
  
  cmLocalGenerator::GetSourceFileLanguage_abi_cxx11_
            (&local_1d8,(cmLocalGenerator *)this->LocalGenerator,source);
  if (local_1d8._M_string_length != 0) {
    psVar3 = cmGeneratorTarget::GetObjectName_abi_cxx11_
                       ((this->super_cmCommonTargetGenerator).GeneratorTarget,source);
    (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
      _vptr_cmLocalGenerator[0xc])
              (&local_218,this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget
              );
    std::__cxx11::string::append((char *)&local_218);
    std::__cxx11::string::_M_append((char *)&local_218,(ulong)(psVar3->_M_dataplus)._M_p);
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(this->ObjectFiles)._M_t,&local_218);
    if ((_Rb_tree_header *)iVar4._M_node == &(this->ObjectFiles)._M_t._M_impl.super__Rb_tree_header)
    {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->ObjectFiles,&local_218);
      cmsys::SystemTools::GetFilenamePath((string *)local_198,&local_218);
      cmLocalUnixMakefileGenerator3::ConvertToFullPath
                (&local_238,this->LocalGenerator,(string *)local_198);
      cmsys::SystemTools::MakeDirectory(&local_238,(mode_t *)0x0);
      paVar1 = &local_238.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != paVar1) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->Objects,&local_218);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->CleanFiles,&local_218);
      local_1b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      WriteObjectBuildFile(this,&local_218,&local_1d8,source,&local_1b8);
      psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                         ((cmLocalGenerator *)this->LocalGenerator);
      pcVar2 = (psVar3->_M_dataplus)._M_p;
      local_238._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_238,pcVar2,pcVar2 + psVar3->_M_string_length);
      std::__cxx11::string::append((char *)&local_238);
      std::__cxx11::string::_M_append((char *)&local_238,(ulong)local_218._M_dataplus._M_p);
      cmsys::SystemTools::CollapseFullPath(&local_1f8,&local_238);
      std::__cxx11::string::operator=((string *)&local_238,(string *)&local_1f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      psVar3 = cmSourceFile::GetFullPath_abi_cxx11_(source);
      cmsys::SystemTools::CollapseFullPath(&local_1f8,psVar3);
      cmLocalUnixMakefileGenerator3::AddImplicitDepends
                (this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget,
                 &local_1d8,&local_238,&local_1f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != paVar1) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1b8);
      if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
        operator_delete((void *)local_198._0_8_,local_188[0]._M_allocated_capacity + 1);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,"Warning: Source file \"",0x16);
      psVar3 = cmSourceFile::GetFullPath_abi_cxx11_(source);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_198,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"\" is listed multiple times for target \"",0x27);
      psVar3 = cmGeneratorTarget::GetName_abi_cxx11_
                         ((this->super_cmCommonTargetGenerator).GeneratorTarget);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\".",2);
      std::__cxx11::stringbuf::str();
      cmSystemTools::Message(&local_238,"Warning");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
      std::ios_base::~ios_base(local_128);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteObjectRuleFiles(
  cmSourceFile const& source)
{
  // Identify the language of the source file.
  const std::string& lang =
    this->LocalGenerator->GetSourceFileLanguage(source);
  if (lang.empty()) {
    // don't know anything about this file so skip it
    return;
  }

  // Get the full path name of the object file.
  std::string const& objectName =
    this->GeneratorTarget->GetObjectName(&source);
  std::string obj =
    this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget);
  obj += "/";
  obj += objectName;

  // Avoid generating duplicate rules.
  if (this->ObjectFiles.find(obj) == this->ObjectFiles.end()) {
    this->ObjectFiles.insert(obj);
  } else {
    std::ostringstream err;
    err << "Warning: Source file \"" << source.GetFullPath()
        << "\" is listed multiple times for target \""
        << this->GeneratorTarget->GetName() << "\".";
    cmSystemTools::Message(err.str(), "Warning");
    return;
  }

  // Create the directory containing the object file.  This may be a
  // subdirectory under the target's directory.
  std::string dir = cmSystemTools::GetFilenamePath(obj);
  cmSystemTools::MakeDirectory(this->LocalGenerator->ConvertToFullPath(dir));

  // Save this in the target's list of object files.
  this->Objects.push_back(obj);
  this->CleanFiles.push_back(obj);

  // TODO: Remove
  // std::string relativeObj
  //= this->LocalGenerator->GetHomeRelativeOutputPath();
  // relativeObj += obj;

  // we compute some depends when writing the depend.make that we will also
  // use in the build.make, same with depMakeFile
  std::vector<std::string> depends;

  // generate the build rule file
  this->WriteObjectBuildFile(obj, lang, source, depends);

  // The object file should be checked for dependency integrity.
  std::string objFullPath = this->LocalGenerator->GetCurrentBinaryDirectory();
  objFullPath += "/";
  objFullPath += obj;
  objFullPath = cmSystemTools::CollapseFullPath(objFullPath);
  std::string srcFullPath =
    cmSystemTools::CollapseFullPath(source.GetFullPath());
  this->LocalGenerator->AddImplicitDepends(this->GeneratorTarget, lang,
                                           objFullPath, srcFullPath);
}